

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O0

void __thiscall AdaptorSignature_Encrypt_Test::TestBody(AdaptorSignature_Encrypt_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_f0;
  AssertHelper local_d0;
  Message local_c8;
  Pubkey local_c0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  Message local_88 [3];
  ByteData local_70;
  string local_58;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  AdaptorSignature adaptor_sig;
  AdaptorSignature_Encrypt_Test *this_local;
  
  cfd::core::AdaptorSignature::Encrypt((AdaptorSignature *)&gtest_ar.message_,&::msg,&::sk,&adaptor)
  ;
  cfd::core::AdaptorSignature::GetData(&local_70,(AdaptorSignature *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_58,&local_70);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_38,"adaptor_sig_str","adaptor_sig.GetData().GetHex()",
             &adaptor_sig_str_abi_cxx11_,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  cfd::core::ByteData::~ByteData(&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  cfd::core::Privkey::GetPubkey(&local_c0,&::sk);
  local_a1 = cfd::core::AdaptorSignature::Verify
                       ((AdaptorSignature *)&gtest_ar.message_,&::msg,&local_c0,&adaptor);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  cfd::core::Pubkey::~Pubkey(&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)local_a0,
               (AssertionResult *)"adaptor_sig.Verify(msg, sk.GetPubkey(), adaptor)","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x22,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  cfd::core::AdaptorSignature::~AdaptorSignature((AdaptorSignature *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(AdaptorSignature, Encrypt) {
  auto adaptor_sig = AdaptorSignature::Encrypt(msg, sk, adaptor);

  EXPECT_EQ(adaptor_sig_str, adaptor_sig.GetData().GetHex());
  EXPECT_TRUE(adaptor_sig.Verify(msg, sk.GetPubkey(), adaptor));
}